

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateGarfieldGasTableForLiquidNoble.cpp
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
* ParseInput_abi_cxx11_
            (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
             *__return_storage_ptr__,int argc,char **argv)

{
  char *__s;
  ostream *poVar1;
  double local_80;
  double temperature;
  bool boolLog;
  double dStack_70;
  int logarithmic;
  double maxField;
  double minField;
  int fieldPoints;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string medium;
  char **argv_local;
  int argc_local;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
  *output;
  
  if (argc == 7) {
    if (*argv[1] == 'L') {
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "----> Input Error? Input format of element should be \'Xe\' or \'Ar\', not \'LXe\' or \'LAr.\' Please leave the \'L\' out."
                              );
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      medium.field_2._M_local_buf[0xe] = '\0';
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
      ::tuple<void,_true>(__return_storage_ptr__);
    }
    else {
      __s = argv[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_48,__s,&local_49);
      std::allocator<char>::~allocator(&local_49);
      minField._0_4_ = atoi(argv[2]);
      maxField = atof(argv[3]);
      dStack_70 = atof(argv[4]);
      temperature._4_4_ = atoi(argv[5]);
      local_80 = atof(argv[6]);
      temperature._3_1_ = temperature._4_4_ != 0;
      std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
      ::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_double_&,_double_&,_bool_&,_double_&,_true,_true>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 (int *)&minField,&maxField,&stack0xffffffffffffff90,
                 (bool *)((long)&temperature + 3),&local_80);
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "----> Input Error! Input format should be: ./GenerateGasTable <Element> <nFieldPoints> <minField_VoltsPerCm> <maxField_VoltsPerCm> <Logarithmic:0or1> <Temperature_K>"
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    medium.field_2._M_local_buf[0xf] = '\0';
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_double,_bool,_double>
    ::tuple<void,_true>(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::string, int, double, double, bool, double> ParseInput(
    int argc, char** argv) {
  // Sanity check
  if (argc != 7) {
    std::cout
        << "----> Input Error! Input format should be: ./GenerateGasTable "
           "<Element> <nFieldPoints> <minField_VoltsPerCm> "
           "<maxField_VoltsPerCm> <Logarithmic:0or1> <Temperature_K>"
        << std::endl;
    std::tuple<std::string, int, double, double, bool, double> failure;
    return failure;
  }
  if (argv[1][0] == 'L') {
    std::cout << "----> Input Error? Input format of element should be 'Xe' or "
                 "'Ar', not 'LXe' or 'LAr.' Please leave the 'L' out."
              << std::endl;
    std::tuple<std::string, int, double, double, bool, double> failure;
    return failure;
  }

  // Start extracting things
  std::string medium(argv[1]);
  int fieldPoints = atoi(argv[2]);
  double minField = atof(argv[3]);
  double maxField = atof(argv[4]);
  int logarithmic = atoi(argv[5]);
  bool boolLog;
  double temperature = atof(argv[6]);

  if (logarithmic == 0) {
    boolLog = false;
  } else {
    boolLog = true;
  }
  std::tuple<std::string, int, double, double, bool, double> output(
      medium, fieldPoints, minField, maxField, boolLog, temperature);
  return output;
}